

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send.hpp
# Opt level: O1

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,span<const_unsigned_char,__1L> *s)

{
  error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&> eStack_28;
  
  (*(code *)this)(&eStack_28,sender,io._M_data);
  __return_storage_ptr__->has_error_ = true;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
  ::move_construct<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>
            ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              *)__return_storage_ptr__,&eStack_28);
  if (eStack_28.has_error_ == false) {
    error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>::
    value_storage_impl<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&eStack_28);
  }
  else {
    error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>::
    error_storage_impl<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>&,std::error_code>
              (&eStack_28);
  }
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send (Sender sender, IO io, gsl::span<std::uint8_t const> const & s) {
            return sender (io, s);
        }